

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O3

int CoreVfwprintf(CPalThread *pthrCurrent,PAL_FILE *stream,char16_t *format,__va_list_tag *aparg)

{
  undefined4 uVar1;
  long lVar2;
  LPCSTR lpMultiByteStr;
  undefined1 Width_00 [4];
  INT IVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  errno_t eVar7;
  INT IVar8;
  uint uVar9;
  ulong uVar10;
  CPalThread *pCVar11;
  size_t sVar12;
  PAL_FILE *stream_00;
  undefined4 *puVar13;
  CPalThread *__s;
  INT *pIVar14;
  undefined8 *puVar15;
  short *psVar16;
  CPalThread *pthrCurrent_00;
  int *piVar17;
  undefined2 *puVar18;
  CPalThread *in_R8;
  LPINT in_R9;
  WCHAR aWVar19 [2];
  long lVar20;
  int iVar21;
  long in_FS_OFFSET;
  ulong uStack_8a8;
  va_list apcopy;
  uint local_888;
  int local_884;
  INT Prefix;
  LPCWSTR Fmt;
  undefined1 local_870 [4];
  WCHAR TempWChar [2];
  INT Flags;
  undefined1 local_864 [4];
  INT Type;
  INT Width;
  INT Precision;
  DWORD DStack_854;
  va_list ap;
  undefined1 local_838 [8];
  char TempSprintfStrBuffer [1024];
  CHAR TempBuff [1024];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _Prefix = (CPalThread *)format;
  if (PAL_InitializeChakraCoreCalled) {
    ap[0].overflow_arg_area = aparg->reg_save_area;
    Precision = aparg->gp_offset;
    DStack_854 = aparg->fp_offset;
    ap[0]._0_8_ = aparg->overflow_arg_area;
    aWVar19[0] = L'\0';
    aWVar19[1] = L'\0';
    apcopy[0].reg_save_area = stream;
LAB_00318394:
    while( true ) {
      if (*(short *)&_Prefix->_vptr_CPalThread == 0x25) break;
      if (*(short *)&_Prefix->_vptr_CPalThread == 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00318d8b;
        goto LAB_00318d4e;
      }
LAB_00318453:
      pCVar11 = _Prefix;
      _Prefix = (CPalThread *)((long)&_Prefix->_vptr_CPalThread + 2);
      iVar5 = Internal_Convertfwrite
                        (pCVar11,&DAT_00000001,(size_t)((CPalThread *)stream)->_vptr_CPalThread,
                         (size_t)aparg,(FILE *)in_R8,(BOOL)in_R9);
      if (iVar5 == -1) goto LAB_00318d3c;
      aWVar19 = (WCHAR  [2])((int)aWVar19 + 1);
    }
    aparg = (__va_list_tag *)local_870;
    in_R8 = (CPalThread *)local_864;
    in_R9 = &Type;
    BVar4 = Internal_ExtractFormatW
                      (_Prefix,(LPCWSTR *)&Prefix,TempSprintfStrBuffer + 0x3f8,(LPINT)aparg,
                       (LPINT)in_R8,in_R9,(LPINT)&local_888,&Flags);
    uVar6 = local_888;
    if (BVar4 == 0) goto LAB_00318453;
    IVar8 = Flags;
    if ((local_888 != 4) && (local_888 != 2)) {
      if (Flags == 3) {
        IVar8 = 3;
        if (((uint)local_870 & 4) != 0) goto LAB_0031840c;
LAB_003185ba:
        apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
        uStack_8a8 = _Precision;
        apcopy[0].gp_offset = ap[0].gp_offset;
        apcopy[0].fp_offset = ap[0].fp_offset;
        TempWChar = aWVar19;
        uVar9 = vsnprintf(local_838,0x400,TempSprintfStrBuffer + 0x3f8,&uStack_8a8);
        IVar3 = Type;
        Width_00 = local_864;
        PAL_printf_arg_remover((va_list *)&Precision,(INT)local_864,Type,IVar8,uVar6);
        if (uVar9 < 0x400) {
          __s = (CPalThread *)local_838;
          pCVar11 = (CPalThread *)0x0;
          aWVar19 = TempWChar;
        }
        else {
          Width = IVar3;
          __s = (CPalThread *)CorUnix::InternalMalloc((long)(int)(uVar9 + 1));
          if (__s == (CPalThread *)0x0) {
LAB_00318d72:
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_00318d8b;
            piVar17 = __errno_location();
            *piVar17 = 8;
            goto LAB_00318d48;
          }
          apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
          uStack_8a8 = _Precision;
          apcopy[0].gp_offset = ap[0].gp_offset;
          apcopy[0].fp_offset = ap[0].fp_offset;
          vsnprintf((char *)__s,(long)(int)(uVar9 + 1),TempSprintfStrBuffer + 0x3f8,&uStack_8a8);
          PAL_printf_arg_remover((va_list *)&Precision,(INT)Width_00,Width,IVar8,uVar6);
          pCVar11 = __s;
          aWVar19 = TempWChar;
        }
      }
      else {
LAB_003184e7:
        if (Flags == 6) {
          if (local_864 == (undefined1  [4])0xfffffffe) {
            uVar10 = _Precision & 0xffffffff;
            if (uVar10 < 0x29) {
              _Precision = CONCAT44(DStack_854,Precision + 8);
              piVar17 = (int *)(uVar10 + (long)ap[0].overflow_arg_area);
            }
            else {
              piVar17 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            local_864 = (undefined1  [4])*piVar17;
          }
          if (Type == -2) {
            uVar10 = _Precision & 0xffffffff;
            if (uVar10 < 0x29) {
              _Precision = CONCAT44(DStack_854,Precision + 8);
              pIVar14 = (INT *)(uVar10 + (long)ap[0].overflow_arg_area);
            }
            else {
              pIVar14 = (INT *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            Type = *pIVar14;
          }
          if (local_888 == 1) {
            uVar10 = _Precision & 0xffffffff;
            if (uVar10 < 0x29) {
              aparg = (__va_list_tag *)(ulong)(Precision + 8U);
              _Precision = CONCAT44(DStack_854,Precision + 8U);
              puVar15 = (undefined8 *)(uVar10 + (long)ap[0].overflow_arg_area);
            }
            else {
              aparg = (__va_list_tag *)(ap[0]._0_8_ + 8);
              puVar15 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = aparg;
            }
            *(WCHAR *)*puVar15 = aWVar19[0];
          }
          else {
            uVar10 = _Precision & 0xffffffff;
            if (uVar10 < 0x29) {
              aparg = (__va_list_tag *)(ulong)(Precision + 8U);
              _Precision = CONCAT44(DStack_854,Precision + 8U);
              puVar15 = (undefined8 *)(uVar10 + (long)ap[0].overflow_arg_area);
            }
            else {
              aparg = (__va_list_tag *)(ap[0]._0_8_ + 8);
              puVar15 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = aparg;
            }
            *(WCHAR (*) [2])*puVar15 = aWVar19;
          }
          goto LAB_00318394;
        }
        if (Flags == 5 && (local_888 ^ 1) == 0) {
          uVar10 = _Precision & 0xffffffff;
          __s = (CPalThread *)local_838;
          if (uVar10 < 0x29) {
            _Precision = CONCAT44(DStack_854,Precision + 8);
            puVar13 = (undefined4 *)(uVar10 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar13 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar1 = *puVar13;
          uVar6 = snprintf((char *)__s,0x400,TempSprintfStrBuffer + 0x3f8,(long)(short)uVar1);
          if (uVar6 < 0x400) {
            pCVar11 = (CPalThread *)0x0;
          }
          else {
            sVar12 = (size_t)(int)(uVar6 + 1);
            __s = (CPalThread *)CorUnix::InternalMalloc(sVar12);
            if (__s == (CPalThread *)0x0) goto LAB_00318d72;
            uVar6 = (uint)(short)uVar1;
LAB_00318b57:
            snprintf((char *)__s,sVar12,TempSprintfStrBuffer + 0x3f8,(ulong)uVar6);
            pCVar11 = __s;
          }
        }
        else {
          if ((local_888 ^ 1) != 0 || Flags != 4) goto LAB_003185ba;
          uVar10 = _Precision & 0xffffffff;
          if (uVar10 < 0x29) {
            _Precision = CONCAT44(DStack_854,Precision + 8);
            psVar16 = (short *)(uVar10 + (long)ap[0].overflow_arg_area);
          }
          else {
            psVar16 = (short *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar6 = (uint)*psVar16;
          __s = (CPalThread *)local_838;
          uVar9 = snprintf((char *)__s,0x400,TempSprintfStrBuffer + 0x3f8,(ulong)uVar6);
          if (0x3ff < uVar9) {
            sVar12 = (size_t)(int)(uVar9 + 1);
            __s = (CPalThread *)CorUnix::InternalMalloc(sVar12);
            if (__s == (CPalThread *)0x0) goto LAB_00318d72;
            goto LAB_00318b57;
          }
          pCVar11 = (CPalThread *)0x0;
        }
      }
      uVar6 = MultiByteToWideChar(0,0,(LPCSTR)__s,-1,(LPWSTR)0x0,0);
      if (uVar6 != 0) {
        pthrCurrent_00 = (CPalThread *)CorUnix::InternalMalloc((long)(int)uVar6 * 2);
        if (pthrCurrent_00 != (CPalThread *)0x0) {
          aparg = (__va_list_tag *)0xffffffff;
          in_R9 = (LPINT)(ulong)uVar6;
          in_R8 = pthrCurrent_00;
          MultiByteToWideChar(0,0,(LPCSTR)__s,-1,(LPWSTR)pthrCurrent_00,uVar6);
          stream = (PAL_FILE *)apcopy[0].reg_save_area;
          iVar5 = Internal_Convertfwrite
                            (pthrCurrent_00,(void *)(long)(int)(uVar6 - 1),*apcopy[0].reg_save_area,
                             (size_t)aparg,(FILE *)in_R8,(BOOL)in_R9);
          if (iVar5 != -1) {
            if (pCVar11 != (CPalThread *)0x0) {
              CorUnix::InternalFree(pCVar11);
            }
            goto LAB_00318be0;
          }
          if (PAL_InitializeChakraCoreCalled != false) {
            piVar17 = __errno_location();
            strerror(*piVar17);
            if (PAL_InitializeChakraCoreCalled != false) {
              CorUnix::InternalFree(pthrCurrent_00);
              goto LAB_00318cf0;
            }
          }
          goto LAB_00318d8b;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00318d8b;
        piVar17 = __errno_location();
        *piVar17 = 8;
LAB_00318cf0:
        if (pCVar11 != (CPalThread *)0x0) {
LAB_00318cf8:
          CorUnix::InternalFree(pCVar11);
        }
        goto LAB_00318d48;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00318d8b;
      if (pCVar11 != (CPalThread *)0x0) {
        CorUnix::InternalFree(pCVar11);
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) goto LAB_00318d8b;
      goto LAB_00318d48;
    }
    if ((Flags & 0xfffffffeU) != 2) {
      if (Flags != 1 || local_888 != 2) goto LAB_003184e7;
      uVar6 = Precision;
      if ((int)local_864 + 3U < 2) {
        if ((uint)Precision < 0x29) {
          uVar6 = Precision + 8;
          _Precision = CONCAT44(DStack_854,uVar6);
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      if ((Type & 0xfffffffdU) == 0xfffffffc) {
        if (uVar6 < 0x29) {
          uVar6 = uVar6 + 8;
          _Precision = CONCAT44(DStack_854,uVar6);
          goto LAB_00318929;
        }
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_0031894a:
        puVar18 = (undefined2 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      else {
LAB_00318929:
        if (0x28 < uVar6) goto LAB_0031894a;
        _Precision = CONCAT44(DStack_854,uVar6 + 8);
        puVar18 = (undefined2 *)((ulong)uVar6 + (long)ap[0].overflow_arg_area);
      }
      Fmt._4_2_ = *puVar18;
      Fmt._6_2_ = 0;
      aparg = (__va_list_tag *)(ulong)(uint)local_870;
      IVar8 = Internal_AddPaddingVfwprintf
                        ((CPalThread *)stream,(PAL_FILE *)((long)&Fmt + 4),
                         (LPWSTR)(ulong)((int)local_864 - 1),(INT)local_870,(INT)in_R8,(BOOL)in_R9);
      if (IVar8 == -1) goto LAB_00318d3c;
      aWVar19 = (WCHAR  [2])((int)aWVar19 + IVar8);
      goto LAB_00318394;
    }
LAB_0031840c:
    if (local_864 == (undefined1  [4])0xfffffffd) {
      if ((uint)Precision < 0x29) {
        _Precision = CONCAT44(DStack_854,Precision + 8);
      }
      else {
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      local_884 = -3;
    }
    else {
      local_884 = (int)local_864;
      if (local_864 == (undefined1  [4])0xfffffffe) {
        uVar10 = _Precision & 0xffffffff;
        if (uVar10 < 0x29) {
          _Precision = CONCAT44(DStack_854,Precision + 8);
          piVar17 = (int *)(uVar10 + (long)ap[0].overflow_arg_area);
        }
        else {
          piVar17 = (int *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        local_884 = *piVar17;
        local_864 = (undefined1  [4])local_884;
      }
    }
    if (Type == -4) {
      if ((uint)Precision < 0x29) {
        _Precision = CONCAT44(DStack_854,Precision + 8);
      }
      else {
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      iVar5 = -4;
    }
    else {
      iVar5 = Type;
      if (Type == -2) {
        uVar10 = _Precision & 0xffffffff;
        if (uVar10 < 0x29) {
          _Precision = CONCAT44(DStack_854,Precision + 8);
          piVar17 = (int *)(uVar10 + (long)ap[0].overflow_arg_area);
        }
        else {
          piVar17 = (int *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        iVar5 = *piVar17;
        Type = iVar5;
      }
    }
    uVar10 = _Precision & 0xffffffff;
    Width = CONCAT31(Width._1_3_,local_888 == 4 || IVar8 == 2);
    if (local_888 == 4 || IVar8 == 2) {
      if ((uint)Precision < 0x29) {
        _Precision = CONCAT44(DStack_854,Precision + 8);
        puVar15 = (undefined8 *)(uVar10 + (long)ap[0].overflow_arg_area);
      }
      else {
        puVar15 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      pCVar11 = (CPalThread *)*puVar15;
      TempWChar = aWVar19;
    }
    else {
      if ((uint)Precision < 0x29) {
        _Precision = CONCAT44(DStack_854,Precision + 8);
        puVar15 = (undefined8 *)(uVar10 + (long)ap[0].overflow_arg_area);
      }
      else {
        puVar15 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      lpMultiByteStr = (LPCSTR)*puVar15;
      TempWChar = aWVar19;
      uVar6 = MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)0x0,0);
      if (uVar6 == 0) {
        fprintf(_stderr,"] %s %s:%d","CoreVfwprintf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                ,0x4d8);
        fprintf(_stderr,"Unable to convert from multibyte  to wide char.\n");
        goto LAB_00318d3c;
      }
      pCVar11 = (CPalThread *)CorUnix::InternalMalloc((ulong)uVar6 * 2);
      if (pCVar11 == (CPalThread *)0x0) goto LAB_00318d3c;
      in_R9 = (LPINT)(ulong)uVar6;
      in_R8 = pCVar11;
      MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)pCVar11,uVar6);
    }
    sVar12 = PAL_wcslen((char16_t *)pCVar11);
    lVar20 = (sVar12 << 0x20) + 0x100000000;
    stream_00 = (PAL_FILE *)CorUnix::InternalMalloc(lVar20 >> 0x1f);
    if (stream_00 == (PAL_FILE *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00318d8b;
      piVar17 = __errno_location();
      *piVar17 = 8;
      if ((char)Width == '\0') goto LAB_00318cf8;
      goto LAB_00318d48;
    }
    if (iVar5 == -3) {
      *(undefined2 *)&stream_00->bsdFilePtr = 0;
      iVar21 = 0;
    }
    else {
      iVar21 = (int)sVar12;
      if ((iVar5 < 1) || (iVar21 <= iVar5)) {
        PAL_wcscpy((char16_t *)stream_00,(char16_t *)pCVar11);
      }
      else {
        eVar7 = wcsncpy_s((char16_t_conflict *)stream_00,lVar20 >> 0x20,(char16_t_conflict *)pCVar11
                          ,(ulong)(iVar5 + 1));
        iVar21 = iVar5;
        if (eVar7 != 0) goto LAB_00318c18;
      }
    }
    stream = (PAL_FILE *)apcopy[0].reg_save_area;
    aparg = (__va_list_tag *)(ulong)(uint)local_870;
    IVar8 = Internal_AddPaddingVfwprintf
                      ((CPalThread *)apcopy[0].reg_save_area,stream_00,
                       (LPWSTR)(ulong)(uint)(local_884 - iVar21),(INT)local_870,(INT)in_R8,
                       (BOOL)in_R9);
    if (IVar8 != -1) goto code_r0x003188cb;
    goto LAB_00318c18;
  }
LAB_00318d8b:
  abort();
code_r0x003188cb:
  aWVar19 = (WCHAR  [2])((int)TempWChar + IVar8);
  CorUnix::InternalFree(stream_00);
  pthrCurrent_00 = pCVar11;
  if ((char)Width == '\0') {
LAB_00318be0:
    CorUnix::InternalFree(pthrCurrent_00);
  }
  goto LAB_00318394;
LAB_00318c18:
  if (PAL_InitializeChakraCoreCalled != false) {
    if ((char)Width == '\0') {
      CorUnix::InternalFree(pCVar11);
    }
    CorUnix::InternalFree(stream_00);
LAB_00318d3c:
    if (PAL_InitializeChakraCoreCalled != false) {
LAB_00318d48:
      aWVar19[0] = L'\xffff';
      aWVar19[1] = L'\xffff';
LAB_00318d4e:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      iVar5._0_2_ = aWVar19[0];
      iVar5._2_2_ = aWVar19[1];
      return iVar5;
    }
  }
  goto LAB_00318d8b;
}

Assistant:

int CoreVfwprintf(CPalThread *pthrCurrent, PAL_FILE *stream, const char16_t *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCWSTR Fmt = format;
    LPWSTR TempWStr = NULL;
    LPWSTR WorkingWStr = NULL;
    WCHAR TempWChar[2];
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT TempInt;
    BOOL WStrWasMalloced = FALSE;
    int mbtowcResult;
    int written=0;
    int paddingReturnValue;
    int ret;
    va_list ap;

    /* fwprintf for now in the PAL is always used on file opened
       in text mode. In those case the output should be ANSI not Unicode */
    BOOL textMode = TRUE;

    PERF_ENTRY(vfwprintf);
    ENTRY("vfwprintf (stream=%p, format=%p (%S))\n",
          stream, format, format);

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatW(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (((Prefix == PFF_PREFIX_LONG || Prefix == PFF_PREFIX_LONG_W) &&
                 (Type == PFF_TYPE_STRING || Type == PFF_TYPE_WSTRING)) ||
                 (Type == PFF_TYPE_WSTRING && (Flags & PFF_ZERO) != 0))
            {
                WStrWasMalloced = FALSE;

                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (Type == PFF_TYPE_STRING || Prefix == PFF_PREFIX_LONG_W)
                {
                    TempWStr = va_arg(ap, LPWSTR);
                }
                else
                {
                    /* %lS assumes a LPSTR argument. */
                    LPSTR s = va_arg(ap, LPSTR );
                    UINT Length = 0;
                    Length = MultiByteToWideChar( CP_ACP, 0, s, -1, NULL, 0 );
                    if ( Length != 0 )
                    {
                        TempWStr =
                            (LPWSTR)InternalMalloc( (Length) * sizeof( WCHAR ) );
                        if ( TempWStr )
                        {
                            WStrWasMalloced = TRUE;
                            MultiByteToWideChar( CP_ACP, 0, s, -1,
                                                 TempWStr, Length );
                        }
                        else
                        {
                            ERROR( "InternalMalloc failed.\n" );
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            va_end(ap);
                            return -1;
                        }
                    }
                    else
                    {
                        ASSERT( "Unable to convert from multibyte "
                               " to wide char.\n" );
                        LOGEXIT("vfwprintf returns int -1\n");
                        PERF_EXIT(vfwprintf);
                        va_end(ap);
                        return -1;
                    }
                }

                INT Length = PAL_wcslen(TempWStr);
                WorkingWStr = (LPWSTR) InternalMalloc((sizeof(WCHAR) * (Length + 1)));
                if (!WorkingWStr)
                {
                    ERROR("InternalMalloc failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if (WStrWasMalloced)
                    {
                        InternalFree(TempWStr);
                    }
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *WorkingWStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length)
                {
                    if (wcsncpy_s(WorkingWStr, (Length + 1), TempWStr, Precision+1) != SAFECRT_SUCCESS)
                    {
                        ERROR("Internal_AddPaddingVfwprintf failed\n");
                        if (WStrWasMalloced)
                        {
                            InternalFree(TempWStr);
                        }
                        InternalFree(WorkingWStr);
                        LOGEXIT("wcsncpy_s failed!\n");
                        PERF_EXIT(vfwprintf);
                        va_end(ap);
                        return (-1);
                    }

                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    PAL_wcscpy(WorkingWStr, TempWStr);
                }


                /* do the padding (if needed)*/
                paddingReturnValue =
                    Internal_AddPaddingVfwprintf( pthrCurrent, stream, WorkingWStr,
                                                 Width - Length,
                                                 Flags,textMode);

                if (paddingReturnValue == -1)
                {
                    ERROR("Internal_AddPaddingVfwprintf failed\n");
                    if (WStrWasMalloced)
                    {
                        InternalFree(TempWStr);
                    }
                    InternalFree(WorkingWStr);
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return (-1);
                }
                written += paddingReturnValue;

                InternalFree(WorkingWStr);
                if (WStrWasMalloced)
                {
                    InternalFree(TempWStr);
                }
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar[0] = va_arg(ap, int);
                TempWChar[1] = 0;

               /* do the padding (if needed)*/
                paddingReturnValue =
                    Internal_AddPaddingVfwprintf(pthrCurrent, stream, TempWChar,
                                                 Width - 1,
                                                 Flags,textMode);
                if (paddingReturnValue == -1)
                {
                    ERROR("Internal_AddPaddingVfwprintf failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return(-1);
                }
                written += paddingReturnValue;
            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            else
            {
                // Types that sprintf can handle.

                /* note: I'm using the wide buffer as a (char *) buffer when I
                   pass it to sprintf().  After I get the buffer back I make a
                   backup of the chars copied and then convert them to wide
                   and place them in the buffer (BufferPtr) */

                // This argument will be limited to 1024 characters.
                // It should be enough.
                size_t TEMP_COUNT = 1024;
                char TempSprintfStrBuffer[1024];
                char *TempSprintfStrPtr = NULL;
                char *TempSprintfStr = TempSprintfStrBuffer;
                LPWSTR TempWideBuffer;

                TempInt = 0;
                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf(TempSprintfStr, TEMP_COUNT, TempBuff, trunc1);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        snprintf(TempSprintfStr, TempInt, TempBuff, trunc2);
                    }
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(TempSprintfStr, TEMP_COUNT, TempBuff, s);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        snprintf(TempSprintfStr, TempInt, TempBuff, s);
                    }
                }
                else
                {
                    va_list apcopy;

                    va_copy(apcopy, ap);
                    TempInt = vsnprintf(TempSprintfStr, TEMP_COUNT, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        va_copy(apcopy, ap);
                        vsnprintf(TempSprintfStr, TempInt, TempBuff, apcopy);
                        va_end(apcopy);
                        PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                    }
                }

                mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                   TempSprintfStr, -1,
                                                   NULL, 0);

                if (mbtowcResult == 0)
                {
                    ERROR("MultiByteToWideChar failed\n");
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return -1;
                }

                TempWideBuffer = (LPWSTR) InternalMalloc(mbtowcResult*sizeof(WCHAR));
                if (!TempWideBuffer)
                {
                    ERROR("InternalMalloc failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    va_end(ap);
                    return -1;
                }

                MultiByteToWideChar(CP_ACP, 0, TempSprintfStr, -1,
                                    TempWideBuffer, mbtowcResult);

                ret = Internal_Convertfwrite(
                                    pthrCurrent,
                                    TempWideBuffer,
                                    sizeof(char16_t),
                                    mbtowcResult-1,
                                    (FILE*)stream->bsdFilePtr,
                                    textMode);

                if (-1 == ret)
                {
                    ERROR("fwrite() failed with errno == %d (%s)\n", errno, strerror(errno));
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    InternalFree(TempWideBuffer);
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    va_end(ap);
                    return -1;
                }
                if(TempSprintfStrPtr)
                {
                    InternalFree(TempSprintfStrPtr);
                }
                InternalFree(TempWideBuffer);
            }
        }
        else
        {
            ret = Internal_Convertfwrite(
                                    pthrCurrent,
                                    Fmt++,
                                    sizeof(char16_t),
                                    1,
                                    (FILE*)stream->bsdFilePtr,
                                    textMode); /* copy regular chars into buffer */

            if (-1 == ret)
            {
                ERROR("fwrite() failed with errno == %d\n", errno);
                LOGEXIT("vfwprintf returns int -1\n");
                PERF_EXIT(vfwprintf);
                va_end(ap);
                return -1;
            }
            ++written;
       }
    }

    LOGEXIT("vfwprintf returns int %d\n", written);
    PERF_EXIT(vfwprintf);
    va_end(ap);
    return (written);
}